

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl.cpp
# Opt level: O1

int __thiscall pg::DTLSolver::best_vertices(DTLSolver *this,bitset *V,bitset *R,int player)

{
  ulong *puVar1;
  int iVar2;
  uint uVar3;
  uint64_t *puVar4;
  Game *pGVar5;
  uint64_t *puVar6;
  long lVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  unsigned_long *__tmp_1;
  size_t sVar11;
  ostream *poVar12;
  long lVar13;
  ulong uVar14;
  size_t sVar15;
  size_t sVar16;
  int *piVar17;
  int *piVar18;
  uint uVar19;
  uint *puVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  char cVar24;
  bitset Z;
  bitset prevV;
  bitset CurZ;
  bitset CurR;
  int local_ec;
  bitset local_d0;
  ulong local_b0;
  int local_a4;
  bitset local_a0;
  _label_vertex local_80;
  bitset local_70;
  bitset local_50;
  
  puVar4 = V->_bits;
  sVar11 = 0;
  do {
    sVar15 = sVar11;
    if (V->_bitssize == sVar15) goto LAB_0017ed04;
    sVar11 = sVar15 + 1;
  } while (puVar4[sVar15] == 0);
  if (V->_bitssize != sVar15) {
    __assert_fail("V.none()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/dtl.cpp"
                  ,0x288,"int pg::DTLSolver::best_vertices(bitset &, bitset &, const int)");
  }
LAB_0017ed04:
  pGVar5 = (this->super_Solver).game;
  local_a0._size = pGVar5->n_vertices;
  uVar21 = local_a0._size + 0x3f;
  local_a0._bitssize = uVar21 >> 6;
  uVar22 = local_a0._bitssize << 3;
  local_a0._allocsize = uVar22;
  local_a0._bits = (uint64_t *)operator_new__(uVar22);
  if (0x3f < uVar21) {
    memset(local_a0._bits,0,uVar22);
  }
  local_d0._size = pGVar5->n_vertices;
  uVar21 = local_d0._size + 0x3f;
  local_d0._bitssize = uVar21 >> 6;
  uVar22 = local_d0._bitssize << 3;
  local_d0._allocsize = uVar22;
  local_d0._bits = (uint64_t *)operator_new__(uVar22);
  if (0x3f < uVar21) {
    memset(local_d0._bits,0,uVar22);
  }
  local_50._size = pGVar5->n_vertices;
  uVar21 = local_50._size + 0x3f;
  local_50._bitssize = uVar21 >> 6;
  uVar22 = local_50._bitssize << 3;
  local_50._allocsize = uVar22;
  local_50._bits = (uint64_t *)operator_new__(uVar22);
  if (0x3f < uVar21) {
    memset(local_50._bits,0,uVar22);
  }
  local_70._size = pGVar5->n_vertices;
  uVar21 = local_70._size + 0x3f;
  local_70._bitssize = uVar21 >> 6;
  uVar22 = local_70._bitssize << 3;
  local_70._allocsize = uVar22;
  local_70._bits = (uint64_t *)operator_new__(uVar22);
  if (0x3f < uVar21) {
    memset(local_70._bits,0,uVar22);
  }
  if (0 < pGVar5->n_vertices) {
    puVar6 = R->_bits;
    uVar21 = 0;
    bVar23 = false;
    do {
      if (((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0) &&
         ((pGVar5->_priority[uVar21] & 1U) == player)) {
        puVar1 = puVar4 + (uVar21 >> 6);
        *puVar1 = *puVar1 | 1L << (uVar21 & 0x3f);
        bVar23 = true;
      }
      uVar21 = uVar21 + 1;
    } while ((long)uVar21 < pGVar5->n_vertices);
    if (bVar23) {
      local_b0 = 0;
      do {
        bitset::operator=(&local_a0,V);
        if (2 < (this->super_Solver).trace) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_Solver).logger,"\x1b[1;38;5;202mcurrent best vertices:\x1b[m",0x26
                    );
          for (sVar11 = bitset::find_first(V); sVar11 != 0xffffffffffffffff;
              sVar11 = bitset::find_next(V,sVar11)) {
            poVar12 = (this->super_Solver).logger;
            std::__ostream_insert<char,std::char_traits<char>>(poVar12," \x1b[1;38;5;15m",0xd);
            local_80.g = (this->super_Solver).game;
            local_80.v = (int)sVar11;
            poVar12 = operator<<(poVar12,&local_80);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
          }
          poVar12 = (this->super_Solver).logger;
          cVar24 = (char)poVar12;
          std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar24);
          std::ostream::put(cVar24);
          std::ostream::flush();
        }
        bitset::operator=(&local_50,R);
        uVar9 = (int)((this->super_Solver).game)->n_vertices - 1;
        if (-1 < (int)uVar9) {
          uVar21 = (ulong)uVar9;
          do {
            uVar22 = uVar21 >> 6;
            if (((V->_bits[uVar22] >> (uVar21 & 0x3f) & 1) != 0) &&
               (uVar14 = 1L << (uVar21 & 0x3f), (local_d0._bits[uVar22] & uVar14) == 0)) {
              local_70._bits[uVar22] = local_70._bits[uVar22] | uVar14;
              this->str[uVar21] = -1;
              iVar10 = (this->Q).pointer;
              (this->Q).pointer = iVar10 + 1;
              (this->Q).queue[iVar10] = (uint)uVar21;
              iVar10 = (this->Q).pointer;
              if (iVar10 != 0) {
                iVar2 = ((this->super_Solver).game)->_priority[uVar21];
                do {
                  (this->Q).pointer = iVar10 + -1;
                  uVar3 = (this->Q).queue[(long)iVar10 + -1];
                  uVar22 = (ulong)(int)uVar3;
                  bVar8 = (byte)uVar3 & 0x3f;
                  local_50._bits[uVar22 >> 6] =
                       local_50._bits[uVar22 >> 6] &
                       (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                  attractVertices(this,player,uVar3,&local_50,&local_70,&local_50,iVar2);
                  piVar18 = this->tin[uVar22].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  for (piVar17 = this->tin[uVar22].super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start; piVar17 != piVar18;
                      piVar17 = piVar17 + 1) {
                    attractTangle(this,*piVar17,player,&local_50,&local_70,&local_50,iVar2);
                  }
                  iVar10 = (this->Q).pointer;
                } while (iVar10 != 0);
              }
              if (local_d0._bitssize != 0) {
                uVar22 = 0;
                do {
                  local_d0._bits[uVar22] = local_d0._bits[uVar22] | local_70._bits[uVar22];
                  uVar22 = uVar22 + 1;
                } while (local_d0._bitssize != uVar22);
              }
              if (local_70._bitssize != 0) {
                memset(local_70._bits,0,local_70._bitssize << 3);
              }
            }
            bVar23 = 0 < (long)uVar21;
            uVar21 = uVar21 - 1;
          } while (bVar23);
        }
        pGVar5 = (this->super_Solver).game;
        lVar7 = pGVar5->n_vertices;
        uVar9 = (int)lVar7 - 1;
        if ((int)uVar9 < 0) {
          uVar19 = 0;
        }
        else {
          puVar4 = V->_bits;
          piVar17 = this->Candidates;
          uVar19 = 0;
          uVar21 = (ulong)uVar9;
          do {
            if ((puVar4[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0) {
              if ((uint)(((pGVar5->_owner)._bits[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0) ==
                  player) {
                uVar22 = (ulong)pGVar5->_outedges[pGVar5->_firstouts[uVar21]];
                bVar23 = uVar22 != 0xffffffffffffffff;
                if (bVar23) {
                  if ((local_d0._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) goto LAB_0017f287;
                  piVar18 = pGVar5->_outedges + (long)pGVar5->_firstouts[uVar21] + 1;
                  do {
                    uVar22 = (ulong)*piVar18;
                    bVar23 = uVar22 != 0xffffffffffffffff;
                    if (uVar22 == 0xffffffffffffffff) break;
                    piVar18 = piVar18 + 1;
                  } while ((local_d0._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0);
                }
LAB_0017f26d:
                if (bVar23) goto LAB_0017f287;
              }
              else {
                uVar9 = pGVar5->_outedges[pGVar5->_firstouts[uVar21]];
                if (uVar9 != 0xffffffff) {
                  puVar20 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar21] + 1);
                  bVar23 = false;
                  bVar8 = 0;
                  do {
                    if ((local_d0._bits[(ulong)(long)(int)uVar9 >> 6] >> ((ulong)uVar9 & 0x3f) & 1)
                        == 0) {
                      cVar24 = (R->_bits[(ulong)(long)(int)uVar9 >> 6] & 1L << ((ulong)uVar9 & 0x3f)
                               ) != 0;
                    }
                    else {
                      bVar8 = 1;
                      cVar24 = '\a';
                    }
                    if ((cVar24 != '\a') && (cVar24 != '\0')) break;
                    uVar9 = *puVar20;
                    puVar20 = puVar20 + 1;
                    bVar23 = uVar9 == 0xffffffff;
                  } while (!bVar23);
                  bVar23 = (bool)(bVar23 & bVar8);
                  goto LAB_0017f26d;
                }
              }
              lVar13 = (long)(int)uVar19;
              uVar19 = uVar19 + 1;
              piVar17[lVar13] = (int)uVar21;
            }
LAB_0017f287:
            bVar23 = 0 < (long)uVar21;
            uVar21 = uVar21 - 1;
          } while (bVar23);
        }
        local_b0 = (ulong)((int)local_b0 + 1);
        if (uVar19 == 0) {
LAB_0017f6e6:
          bVar23 = false;
          local_ec = 1;
        }
        else {
          local_a4 = *(int *)((long)pGVar5->_priority + ((lVar7 << 0x20) + -0x100000000 >> 0x1e));
          if (-1 < local_a4) {
            iVar10 = 0;
            do {
              for (sVar11 = bitset::find_first(&local_d0); sVar11 != 0xffffffffffffffff;
                  sVar11 = bitset::find_next(&local_d0,sVar11)) {
                iVar2 = (this->Q).pointer;
                (this->Q).pointer = iVar2 + 1;
                (this->Q).queue[iVar2] = (uint)sVar11;
              }
              iVar2 = (this->Q).pointer;
              while (iVar2 != 0) {
                (this->Q).pointer = iVar2 + -1;
                uVar3 = (this->Q).queue[(long)iVar2 + -1];
                attractVertices(this,player,uVar3,R,&local_d0,R,iVar10);
                piVar18 = this->tin[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish;
                for (piVar17 = this->tin[(int)uVar3].super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start; piVar17 != piVar18;
                    piVar17 = piVar17 + 1) {
                  attractTangle(this,*piVar17,player,R,&local_d0,R,iVar10);
                }
                iVar2 = (this->Q).pointer;
              }
              if (0 < (int)uVar19) {
                pGVar5 = (this->super_Solver).game;
                piVar17 = this->Candidates;
                uVar21 = 0;
                do {
                  uVar22 = (ulong)piVar17[uVar21];
                  if (uVar22 != 0xffffffffffffffff) {
                    if (pGVar5->_priority[uVar22] <= iVar10) break;
                    if ((uint)(((pGVar5->_owner)._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) != 0) ==
                        player) {
                      uVar14 = (ulong)pGVar5->_outedges[pGVar5->_firstouts[uVar22]];
                      bVar23 = uVar14 != 0xffffffffffffffff;
                      if (uVar14 == 0xffffffffffffffff) {
LAB_0017f4f0:
                        if (!bVar23) goto LAB_0017f4fd;
                      }
                      else if ((local_d0._bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
                        piVar18 = pGVar5->_outedges + (long)pGVar5->_firstouts[uVar22] + 1;
                        do {
                          uVar22 = (ulong)*piVar18;
                          bVar23 = uVar22 != 0xffffffffffffffff;
                          if (uVar22 == 0xffffffffffffffff) break;
                          piVar18 = piVar18 + 1;
                        } while ((local_d0._bits[uVar22 >> 6] >> (uVar22 & 0x3f) & 1) == 0);
                        goto LAB_0017f4f0;
                      }
                      piVar17[uVar21] = -1;
                    }
                    else {
                      uVar9 = pGVar5->_outedges[pGVar5->_firstouts[uVar22]];
                      if (uVar9 != 0xffffffff) {
                        puVar20 = (uint *)(pGVar5->_outedges + (long)pGVar5->_firstouts[uVar22] + 1)
                        ;
                        bVar23 = false;
                        bVar8 = 0;
                        do {
                          if ((local_d0._bits[(ulong)(long)(int)uVar9 >> 6] >> ((ulong)uVar9 & 0x3f)
                              & 1) == 0) {
                            cVar24 = (R->_bits[(ulong)(long)(int)uVar9 >> 6] &
                                     1L << ((ulong)uVar9 & 0x3f)) != 0;
                          }
                          else {
                            bVar8 = 1;
                            cVar24 = '\a';
                          }
                          if ((cVar24 != '\a') && (cVar24 != '\0')) break;
                          uVar9 = *puVar20;
                          puVar20 = puVar20 + 1;
                          bVar23 = uVar9 == 0xffffffff;
                        } while (!bVar23);
                        bVar23 = (bool)(bVar23 & bVar8);
                        goto LAB_0017f4f0;
                      }
                    }
                  }
LAB_0017f4fd:
                  uVar21 = uVar21 + 1;
                } while (uVar21 != uVar19);
              }
              bVar23 = iVar10 != local_a4;
              iVar10 = iVar10 + 1;
            } while (bVar23);
          }
          if ((int)uVar19 < 1) {
            bVar23 = false;
          }
          else {
            uVar21 = 0;
            bVar23 = false;
            do {
              iVar10 = this->Candidates[uVar21];
              if ((long)iVar10 != 0xffffffffffffffff) {
                bVar8 = (byte)iVar10 & 0x3f;
                V->_bits[(ulong)(long)iVar10 >> 6] =
                     V->_bits[(ulong)(long)iVar10 >> 6] &
                     (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
                if (1 < (this->super_Solver).trace) {
                  if (!bVar23) {
                    poVar12 = (this->super_Solver).logger;
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,"\x1b[1;38;5;202mdistance ",0x16);
                    poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)local_b0);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m:",4);
                  }
                  poVar12 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12," \x1b[1;36m",8);
                  local_80.g = (this->super_Solver).game;
                  local_80.v = iVar10;
                  poVar12 = operator<<(poVar12,&local_80);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\x1b[m",3);
                }
                bVar23 = true;
              }
              uVar21 = uVar21 + 1;
            } while (uVar19 != uVar21);
          }
          if ((bVar23) && (0 < (this->super_Solver).trace)) {
            poVar12 = (this->super_Solver).logger;
            cVar24 = (char)poVar12;
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + cVar24);
            std::ostream::put(cVar24);
            std::ostream::flush();
          }
          if (local_d0._bitssize != 0) {
            memset(local_d0._bits,0,local_d0._bitssize << 3);
          }
          if (!bVar23) goto LAB_0017f6e6;
          puVar4 = V->_bits;
          sVar11 = V->_bitssize;
          sVar15 = 0;
          do {
            sVar16 = sVar15;
            if (sVar11 == sVar16) goto LAB_0017f696;
            sVar15 = sVar16 + 1;
          } while (puVar4[sVar16] == 0);
          bVar23 = true;
          if (sVar11 == sVar16) {
LAB_0017f696:
            sVar15 = V->_size;
            V->_size = local_a0._size;
            V->_bitssize = local_a0._bitssize;
            sVar16 = V->_allocsize;
            V->_allocsize = local_a0._allocsize;
            V->_bits = local_a0._bits;
            local_ec = -1;
            bVar23 = false;
            local_a0._bits = puVar4;
            local_a0._size = sVar15;
            local_a0._bitssize = sVar11;
            local_a0._allocsize = sVar16;
          }
        }
      } while (bVar23);
      goto LAB_0017f702;
    }
  }
  local_ec = 0;
LAB_0017f702:
  if (local_70._bits != (uint64_t *)0x0) {
    operator_delete__(local_70._bits);
  }
  if (local_50._bits != (uint64_t *)0x0) {
    operator_delete__(local_50._bits);
  }
  if (local_d0._bits != (uint64_t *)0x0) {
    operator_delete__(local_d0._bits);
  }
  if (local_a0._bits != (uint64_t *)0x0) {
    operator_delete__(local_a0._bits);
  }
  return local_ec;
}

Assistant:

int
DTLSolver::best_vertices(bitset &V, bitset &R, const int player)
{
#ifndef NDEBUG
    // Assume: V is empty
    assert(V.none());
#endif

    bitset prevV(nodecount()); // the previous V
    bitset Z(nodecount()); // the current Z
    bitset CurR(nodecount());
    bitset CurZ(nodecount());
    int curdist = 0;

    /**
     * Initialize V := vertices in <R> with priority of <player>
     */

    bool hasV = false;
    for (int v=0; v<nodecount(); v++) {
        if (R[v] and (priority(v)&1) == player) {
            hasV = true;
            V[v] = true;
        }
    }
    if (!hasV) return 0;

    /**
     * Now we prune until no more vertices are removed from V, or V is empty.
     */

    while (true) {
        curdist++;
        prevV = V;

#ifndef NDEBUG
        if (trace >= 3) {
            logger << "\033[1;38;5;202mcurrent best vertices:\033[m";
            for (auto v = V.find_first(); v != bitset::npos; v = V.find_next(v)) {
                logger << " \033[1;38;5;15m" << label_vertex(v) << "\033[m";
            }
            logger << std::endl;
        }
#endif

        // First compute the current <player> region Z

        CurR = R;
        for (int top=nodecount()-1; top>=0; top--) {
            if (V[top] and !Z[top]) {
                CurZ[top] = true; // add to <Z>
                str[top] = -1; // don't care, but needed for correct trace reporting
                Q.push(top);
                const int pr = priority(top);
                while (Q.nonempty()) {
                    const int v = Q.pop();
                    CurR[v] = false;
                    attractVertices(player, v, CurR, CurZ, CurR, pr);
                    attractTangles(player, v, CurR, CurZ, CurR, pr);
                }
                Z |= CurZ;
                CurZ.reset();
            }
        }

        /**
         * Now find all Candidates: v \in V that do not yet have a good path to Z
         */

        int n_candidates = 0;
        for (int v=nodecount()-1; v>=0; v--) {
            if (V[v] and !attracts(player, v, Z, R)) Candidates[n_candidates++] = v;
        }
        if (n_candidates == 0) return 1; // no more vertices are removed

        // Now attract from R to Z, "slowly"
        // Note: we have to be carefully increasing t. Why?
        // because we might attract tangles OR vertices at some threshold...
        const int max_prio = priority(nodecount()-1);
        for (int t=0; t<=max_prio; t++) {
            // add vertices in Z to Q
            for (auto v = Z.find_first(); v != bitset::npos; v = Z.find_next(v)) Q.push(v);

            // run tangle attractor to Z with the given threshold
            while (Q.nonempty()) {
                const int u = Q.pop();
                attractVertices(player, u, R, Z, R, t);
                attractTangles(player, u, R, Z, R, t);
            }

            // Now check if any candidate is now attracted (via the good path)
            for (int x=0; x<n_candidates; x++) {
                const int u = Candidates[x];
                if (u != -1) {
                    if (priority(u) <= t) break; // stop checking once we are below the threshold
                    if (attracts(player, u, Z, R)) Candidates[x] = -1;
                }
            }
        }

        /**
         * We have now attracted all possible vertices to <Z>.
         * Any remaining vertices in Candidates are now distractions...
         */

        bool changed_V = false;
        for (int x=0; x<n_candidates; x++) {
            const int u = Candidates[x];
            if (u == -1) continue;
            V[u] = false;
            if (trace >= 2) {
                if (!changed_V) {
                    logger << "\033[1;38;5;202mdistance " << curdist << "\033[m:";
                }
                logger << " \033[1;36m" << label_vertex(u) << "\033[m";
            }
            changed_V = true;
        }
        if (changed_V and trace >= 1) logger << std::endl;

        Z.reset();

        if (!changed_V) {
            // No vertices were removed from V
            return 1;
        } else if (!V.any()) {
            // All vertices were removed from V
            V.swap(prevV);
            return -1;
        }
    }

    return true;
}